

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

int __thiscall
CVmConsole::open_script_file
          (CVmConsole *this,CVmNetFile *nf,vm_val_t *filespec,int quiet,int script_more_mode)

{
  int iVar1;
  undefined4 uVar2;
  FILE *__stream;
  char *pcVar3;
  void *pvVar4;
  undefined4 in_ECX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  osfildef *fp;
  char buf [50];
  int evt;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff5c;
  script_stack_entry *encp;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  char local_68 [52];
  undefined4 local_34;
  int local_30;
  undefined4 local_2c;
  int local_c;
  
  if (in_RSI == (undefined8 *)0x0) {
    local_c = 1;
  }
  else {
    local_30 = in_R8D;
    local_2c = in_ECX;
    __stream = fopen((char *)*in_RSI,"r");
    if (__stream == (FILE *)0x0) {
      CVmNetFile::abandon((CVmNetFile *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      local_c = 1;
    }
    else {
      pcVar3 = fgets(local_68,0x32,__stream);
      if ((pcVar3 == (char *)0x0) || (iVar1 = strcmp(local_68,"<eventscript>\n"), iVar1 != 0)) {
        local_34 = 0;
        fseek(__stream,0,0);
      }
      else {
        local_34 = 1;
      }
      iVar1 = (int)__stream;
      if (in_RDI[4] != 0) {
        if (*(int *)(in_RDI[4] + 0x20) != 0) {
          local_2c = 1;
        }
        if (*(int *)(in_RDI[4] + 0x1c) == 0) {
          local_30 = 0;
        }
      }
      pvVar4 = operator_new(0x30);
      encp = (script_stack_entry *)in_RDI[4];
      uVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,local_30);
      script_stack_entry::script_stack_entry
                ((script_stack_entry *)CONCAT44(uVar2,in_stack_ffffffffffffff70),encp,
                 (int)((ulong)pvVar4 >> 0x20),
                 (CVmNetFile *)CONCAT44(in_stack_ffffffffffffff5c,local_34),
                 (osfildef *)CONCAT44(in_stack_ffffffffffffff54,local_2c),
                 (vm_val_t *)CONCAT44(in_stack_ffffffffffffff4c,local_30),in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff88,iVar1);
      in_RDI[4] = (long)pvVar4;
      if (local_30 == 0) {
        os_nonstop_mode(1);
      }
      local_c = 0;
    }
  }
  return local_c;
}

Assistant:

int CVmConsole::open_script_file(VMG_ CVmNetFile *nf, const vm_val_t *filespec,
                                 int quiet, int script_more_mode)
{
    int evt;
    char buf[50];
    
    /* if the network file open failed, return an error */
    if (nf == 0)
        return 1;

    /* open the local file */
    osfildef *fp = osfoprt(nf->lclfname, OSFTCMD);

    /* if that failed, silently ignore the request */
    if (fp == 0)
    {
        /* abandon the network file descriptor and return failure */
        nf->abandon(vmg0_);
        return 1;
    }

    /* read the first line to see if it looks like an event script */
    if (osfgets(buf, sizeof(buf), fp) != 0
        && strcmp(buf, "<eventscript>\n") == 0)
    {
        /* remember that it's an event script */
        evt = TRUE;
    }
    else
    {
        /* 
         *   it's not an event script, so it must be a regular command-line
         *   script - rewind it so we read the first line again as a regular
         *   input line 
         */
        evt = FALSE;
        osfseek(fp, 0, OSFSK_SET);
    }

    /* if there's an enclosing script, inherit its modes */
    if (script_sp_ != 0)
    {
        /* 
         *   if the enclosing script is quiet, force the nested script to be
         *   quiet as well 
         */
        if (script_sp_->quiet)
            quiet = TRUE;

        /* 
         *   if the enclosing script is nonstop, force the nested script to
         *   be nonstop as well
         */
        if (!script_sp_->more_mode)
            script_more_mode = FALSE;
    }

    /* push the new script file onto the stack */
    script_sp_ = new script_stack_entry(
        vmg_ script_sp_, set_more_state(script_more_mode), nf, fp, filespec,
        script_more_mode, quiet, evt);
    
    /* turn on NONSTOP mode in the OS layer if applicable */
    if (!script_more_mode)
        os_nonstop_mode(TRUE);

    /* success */
    return 0;
}